

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O2

ptr<Value> __thiscall Operation::asDoubles(Operation *this,double leftOperand,double rightOperand)

{
  ThrowPacket *this_00;
  allocator<char> local_49;
  undefined1 local_48 [48];
  
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"Operation not defined for Double type",&local_49);
  ExceptionObjects::undefined_operation((string *)local_48);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)local_48);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> Operation::asDoubles(double leftOperand, double rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for Double type"));
}